

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QCommonArrayOps<ClassInfoDef>::growAppend
          (QCommonArrayOps<ClassInfoDef> *this,ClassInfoDef *b,ClassInfoDef *e)

{
  long lVar1;
  bool bVar2;
  ClassInfoDef *e_00;
  ClassInfoDef *in_RDX;
  ClassInfoDef *in_RSI;
  QGenericArrayOps<ClassInfoDef> *in_RDI;
  long in_FS_OFFSET;
  qsizetype n;
  DataPointer old;
  QCommonArrayOps<ClassInfoDef> *c;
  GrowthPosition where;
  ClassInfoDef *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != in_RDX) {
    e_00 = (ClassInfoDef *)(((long)in_RDX - (long)in_RSI) / 0x30);
    c = (QCommonArrayOps<ClassInfoDef> *)&DAT_aaaaaaaaaaaaaaaa;
    this_00 = (ClassInfoDef *)&DAT_aaaaaaaaaaaaaaaa;
    QArrayDataPointer<ClassInfoDef>::QArrayDataPointer
              ((QArrayDataPointer<ClassInfoDef> *)&stack0xffffffffffffffd8);
    bVar2 = q_points_into_range<QtPrivate::QCommonArrayOps<ClassInfoDef>,ClassInfoDef_const*>
                      ((ClassInfoDef **)this_00,c);
    where = (GrowthPosition)((ulong)c >> 0x20);
    if (bVar2) {
      QArrayDataPointer<ClassInfoDef>::detachAndGrow
                ((QArrayDataPointer<ClassInfoDef> *)this_00,where,(qsizetype)in_RDI,
                 (ClassInfoDef **)in_RDX,(QArrayDataPointer<ClassInfoDef> *)e_00);
    }
    else {
      QArrayDataPointer<ClassInfoDef>::detachAndGrow
                ((QArrayDataPointer<ClassInfoDef> *)this_00,where,(qsizetype)in_RDI,
                 (ClassInfoDef **)in_RDX,(QArrayDataPointer<ClassInfoDef> *)e_00);
    }
    QGenericArrayOps<ClassInfoDef>::copyAppend(in_RDI,in_RDX,e_00);
    QArrayDataPointer<ClassInfoDef>::~QArrayDataPointer((QArrayDataPointer<ClassInfoDef> *)e_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }